

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O3

short duckdb::VectorTryCastOperator<duckdb::NumericTryCast>::Operation<unsigned_int,short>
                (uint input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  ushort uVar1;
  string local_48;
  
  if (0x7fff < input) {
    CastExceptionText<unsigned_int,short>(&local_48,(duckdb *)(ulong)input,(uint)idx);
    uVar1 = HandleVectorCastError::Operation<short>(&local_48,mask,idx,(VectorTryCastData *)dataptr)
    ;
    input = (uint)uVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  return (short)input;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}